

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
inja::Parser::add_operator(Parser *this,Arguments *arguments,OperatorStack *operator_stack)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  reference __x;
  __normal_iterator<std::shared_ptr<inja::ExpressionNode>_*,_std::vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>_>
  local_78;
  const_iterator local_70;
  int local_68;
  allocator<char> local_61;
  int i;
  undefined1 local_30 [8];
  value_type function;
  OperatorStack *operator_stack_local;
  Arguments *arguments_local;
  Parser *this_local;
  
  function.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_stack;
  pvVar2 = std::
           stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
           ::top(operator_stack);
  std::shared_ptr<inja::FunctionNode>::shared_ptr((shared_ptr<inja::FunctionNode> *)local_30,pvVar2)
  ;
  std::
  stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
  ::pop((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
         *)function.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi);
  sVar3 = std::
          vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
          ::size(arguments);
  peVar4 = std::__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  if ((int)sVar3 < peVar4->number_args) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&i,"too few arguments",&local_61)
    ;
    throw_parser_error(this,(string *)&i);
    ::std::__cxx11::string::~string((string *)&i);
    ::std::allocator<char>::~allocator(&local_61);
  }
  local_68 = 0;
  while( true ) {
    iVar1 = local_68;
    peVar4 = std::__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    if (peVar4->number_args <= iVar1) break;
    peVar4 = std::__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    peVar5 = std::__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    local_78._M_current =
         (shared_ptr<inja::ExpressionNode> *)
         std::
         vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
         ::begin(&peVar5->arguments);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<inja::ExpressionNode>const*,std::vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>>
    ::__normal_iterator<std::shared_ptr<inja::ExpressionNode>*>
              ((__normal_iterator<std::shared_ptr<inja::ExpressionNode>const*,std::vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>>
                *)&local_70,&local_78);
    __x = std::
          vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
          ::back(arguments);
    std::
    vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
    ::insert(&peVar4->arguments,local_70,__x);
    std::
    vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
    ::pop_back(arguments);
    local_68 = local_68 + 1;
  }
  ::std::
  vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
  ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
            ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
              *)arguments,(shared_ptr<inja::FunctionNode> *)local_30);
  std::shared_ptr<inja::FunctionNode>::~shared_ptr((shared_ptr<inja::FunctionNode> *)local_30);
  return;
}

Assistant:

inline void add_operator(Arguments &arguments, OperatorStack &operator_stack) {
    auto function = operator_stack.top();
    operator_stack.pop();

    if (static_cast<int>(arguments.size()) < function->number_args) {
      throw_parser_error("too few arguments");
    }

    for (int i = 0; i < function->number_args; ++i) {
      function->arguments.insert(function->arguments.begin(), arguments.back());
      arguments.pop_back();
    }
    arguments.emplace_back(function);
  }